

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O0

void __thiscall crnlib::corpus_gen::sort_blocks(corpus_gen *this,image_u8 *img)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  color_quad<unsigned_char,_int> *pcVar4;
  float *pfVar5;
  uint *puVar6;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  float fVar7;
  double dVar8;
  color_quad_u8 *c_2;
  uint x_2;
  uint y_2;
  uint src_block_index_1;
  color_quad_u8 *c_1;
  uint x_1;
  uint y_1;
  uint64 error;
  uint src_block_index_2;
  uint i_3;
  uint64 best_error;
  uint best_index;
  uint bx_1;
  color_quad_u8 match_block [16];
  uint i_2;
  uint by_1;
  vector<unsigned_int> remaining_blocks;
  uint dst_block_y;
  uint dst_block_x;
  uint src_block_y;
  uint src_block_x;
  uint src_block_index;
  uint i_1;
  uint dst_block_index;
  image_u8 new_img;
  uint *pIndices;
  vector<unsigned_int> block_indices1;
  vector<unsigned_int> block_indices0;
  uint i;
  double std_dev;
  uint x;
  uint y;
  color_quad_u8 c [16];
  uint bx;
  uint by;
  vector<float> block_std_dev;
  uint total_blocks;
  uint num_blocks_y;
  uint num_blocks_x;
  undefined1 in_stack_00001257;
  uint in_stack_00001258;
  uint in_stack_0000125c;
  float *in_stack_00001260;
  uint *in_stack_00001268;
  uint *in_stack_00001270;
  uint in_stack_0000127c;
  uint in_stack_fffffffffffffd5c;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_fffffffffffffd60;
  color_quad<unsigned_char,_int> *in_stack_fffffffffffffd68;
  vector<unsigned_int> *in_stack_fffffffffffffd70;
  color_quad<unsigned_char,_int> *in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd80;
  uint in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffd8c;
  undefined8 in_stack_fffffffffffffd90;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined8 in_stack_fffffffffffffda8;
  undefined8 in_stack_fffffffffffffdb0;
  color_quad<unsigned_char,_int> *pcVar9;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_fffffffffffffdb8;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *local_1c8;
  uint local_1b4;
  uint local_1b0;
  uint local_1a0;
  uint local_19c;
  ulong local_198;
  uint local_18c;
  ulong local_188;
  uint local_180;
  uint local_17c;
  color_quad<unsigned_char,_int> local_178 [16];
  color_quad<unsigned_char,_int> acStack_138 [2];
  uint local_130;
  uint local_12c;
  vector<unsigned_int> local_128;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  image<crnlib::color_quad<unsigned_char,_int>_> local_f8;
  uint *local_c8;
  vector<unsigned_int> local_c0;
  vector<unsigned_int> local_b0;
  uint local_9c;
  double local_98;
  uint local_8c;
  uint local_88;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_78 [16];
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_38;
  uint local_34;
  vector<float> local_30;
  uint local_1c;
  uint local_18;
  uint local_14;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_10;
  
  local_10 = in_RSI;
  uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RSI);
  local_14 = uVar2 >> 2;
  uVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_10);
  local_18 = uVar2 >> 2;
  local_1c = local_14 * local_18;
  console::printf("Sorting %u blocks...",(ulong)local_1c);
  vector<float>::vector((vector<float> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  for (local_34 = 0; local_34 < local_18; local_34 = local_34 + 1) {
    for (local_38.m_u32 = 0; local_38.m_u32 < local_14; local_38.m_u32 = local_38.m_u32 + 1) {
      local_1c8 = local_78;
      do {
        color_quad<unsigned_char,_int>::color_quad
                  ((color_quad<unsigned_char,_int> *)&local_1c8->field_0);
        local_1c8 = local_1c8 + 1;
      } while (local_1c8 != &local_38);
      for (local_88 = 0; local_88 < 4; local_88 = local_88 + 1) {
        for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
          pcVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             (local_10,local_8c + local_38.m_u32 * 4,local_88 + local_34 * 4);
          color_quad<unsigned_char,_int>::operator=
                    ((color_quad<unsigned_char,_int> *)&local_78[local_8c + local_88 * 4].field_0,
                     pcVar4);
        }
      }
      local_98 = 0.0;
      for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
        dVar8 = image_utils::compute_std_dev
                          ((uint)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                           (color_quad_u8 *)
                           CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                           (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                           (uint)in_stack_fffffffffffffd98);
        local_98 = dVar8 + local_98;
      }
      fVar7 = (float)local_98;
      pfVar5 = vector<float>::operator[](&local_30,local_38.m_u32 + local_34 * local_14);
      *pfVar5 = fVar7;
    }
  }
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  vector<unsigned_int>::operator[](&local_b0,0);
  vector<unsigned_int>::operator[](&local_c0,0);
  vector<float>::operator[](&local_30,0);
  local_c8 = indirect_radix_sort<unsigned_int,float>
                       (in_stack_0000127c,in_stack_00001270,in_stack_00001268,in_stack_00001260,
                        in_stack_0000125c,in_stack_00001258,(bool)in_stack_00001257);
  image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_10);
  image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_10);
  color_quad<unsigned_char,_int>::make_black();
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (uint)((ulong)in_stack_fffffffffffffd98 >> 0x20),(uint)in_stack_fffffffffffffd98,
             (uint)((ulong)in_stack_fffffffffffffd90 >> 0x20),
             (color_quad<unsigned_char,_int> *)
             CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
             (uint)((ulong)in_stack_fffffffffffffd80 >> 0x20));
  local_100 = 0;
  for (local_104 = 0; local_104 < local_1c; local_104 = local_104 + 1) {
    local_108 = local_c8[local_104];
    local_10c = local_108 % local_14;
    local_110 = local_108 / local_14;
    local_114 = local_100 % local_14;
    local_118 = local_100 / local_14;
    in_stack_fffffffffffffd60 = local_10;
    image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
              (in_stack_fffffffffffffd98,(uint)((ulong)in_stack_fffffffffffffd90 >> 0x20),
               (uint)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88,
               (uint)((ulong)in_stack_fffffffffffffd80 >> 0x20),(uint)in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdb8);
    local_100 = local_100 + 1;
  }
  vector<unsigned_int>::vector
            ((vector<unsigned_int> *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c);
  console::printf("Arranging %u blocks...",(ulong)local_1c);
  for (local_12c = 0; local_12c < local_18; local_12c = local_12c + 1) {
    console::printf("%u of %u",(ulong)local_12c,(ulong)local_18);
    vector<unsigned_int>::resize
              (in_stack_fffffffffffffd70,(uint)((ulong)in_stack_fffffffffffffd68 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd68 >> 0x18,0));
    for (local_130 = 0; uVar2 = local_130, local_130 < local_14; local_130 = local_130 + 1) {
      puVar6 = vector<unsigned_int>::operator[](&local_128,local_130);
      *puVar6 = uVar2;
    }
    pcVar4 = local_178;
    pcVar9 = acStack_138;
    do {
      color_quad<unsigned_char,_int>::color_quad(pcVar4);
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != pcVar9);
    utils::zero_object<crnlib::color_quad<unsigned_char,int>[16]>
              ((color_quad<unsigned_char,_int> (*) [16])0x10605c);
    for (local_17c = 0; local_17c < local_14; local_17c = local_17c + 1) {
      local_180 = 0;
      local_188 = 0xffffffffffffffff;
      local_18c = 0;
      while( true ) {
        uVar2 = local_18c;
        uVar3 = vector<unsigned_int>::size(&local_128);
        if (uVar3 <= uVar2) break;
        puVar6 = vector<unsigned_int>::operator[](&local_128,local_18c);
        uVar1 = *puVar6;
        local_198 = 0;
        for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
          for (local_1a0 = 0; local_1a0 < 4; local_1a0 = local_1a0 + 1) {
            image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                      (&local_f8,local_1a0 + uVar1 * 4,local_19c + local_12c * 4);
            uVar2 = crnlib::color::elucidian_distance
                              (in_stack_fffffffffffffd78,(color_quad_u8 *)in_stack_fffffffffffffd70,
                               SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
            local_198 = uVar2 + local_198;
          }
        }
        if (local_198 < local_188) {
          local_188 = local_198;
          local_180 = local_18c;
        }
        local_18c = local_18c + 1;
      }
      puVar6 = vector<unsigned_int>::operator[](&local_128,local_180);
      uVar1 = *puVar6;
      for (local_1b0 = 0; local_1b0 < 4; local_1b0 = local_1b0 + 1) {
        for (local_1b4 = 0; local_1b4 < 4; local_1b4 = local_1b4 + 1) {
          in_stack_fffffffffffffd68 =
               image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                         (&local_f8,local_1b4 + uVar1 * 4,local_1b0 + local_12c * 4);
          in_stack_fffffffffffffd78 = in_stack_fffffffffffffd68;
          color_quad<unsigned_char,_int>::operator=
                    (local_178 + (local_1b4 + local_1b0 * 4),in_stack_fffffffffffffd68);
          in_stack_fffffffffffffd70 =
               (vector<unsigned_int> *)
               image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                         (local_10,local_1b4 + local_17c * 4,local_1b0 + local_12c * 4);
          color_quad<unsigned_char,_int>::operator=
                    ((color_quad<unsigned_char,_int> *)in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffd68);
        }
      }
      vector<unsigned_int>::erase_unordered
                (in_stack_fffffffffffffd70,(uint)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    }
  }
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffd60);
  image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x1063fb);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffd60);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffd60);
  vector<float>::~vector((vector<float> *)in_stack_fffffffffffffd60);
  return;
}

Assistant:

void corpus_gen::sort_blocks(image_u8& img) {
  const uint num_blocks_x = img.get_width() / 4;
  const uint num_blocks_y = img.get_height() / 4;
  const uint total_blocks = num_blocks_x * num_blocks_y;

  console::printf("Sorting %u blocks...", total_blocks);

  crnlib::vector<float> block_std_dev(total_blocks);

  for (uint by = 0; by < num_blocks_y; by++) {
    for (uint bx = 0; bx < num_blocks_x; bx++) {
      color_quad_u8 c[4 * 4];

      for (uint y = 0; y < 4; y++)
        for (uint x = 0; x < 4; x++)
          c[x + y * 4] = img(bx * 4 + x, by * 4 + y);

      double std_dev = 0.0f;
      for (uint i = 0; i < 3; i++)
        std_dev += image_utils::compute_std_dev(16, c, i, 1);

      block_std_dev[bx + by * num_blocks_x] = (float)std_dev;
    }
  }

  crnlib::vector<uint> block_indices0(total_blocks);
  crnlib::vector<uint> block_indices1(total_blocks);

  const uint* pIndices = indirect_radix_sort(total_blocks, &block_indices0[0], &block_indices1[0], &block_std_dev[0], 0, sizeof(float), true);

  image_u8 new_img(img.get_width(), img.get_height());

  uint dst_block_index = 0;

  //float prev_std_dev = -999;
  for (uint i = 0; i < total_blocks; i++) {
    uint src_block_index = pIndices[i];

    //float std_dev = block_std_dev[src_block_index];
    //crnlib_ASSERT(std_dev >= prev_std_dev);
    //prev_std_dev = std_dev;

    uint src_block_x = src_block_index % num_blocks_x;
    uint src_block_y = src_block_index / num_blocks_x;

    uint dst_block_x = dst_block_index % num_blocks_x;
    uint dst_block_y = dst_block_index / num_blocks_x;

    new_img.unclipped_blit(src_block_x * 4, src_block_y * 4, 4, 4, dst_block_x * 4, dst_block_y * 4, img);

    dst_block_index++;
  }

#if 0      
      //new_img.swap(img);
#else
  crnlib::vector<uint> remaining_blocks(num_blocks_x);

  console::printf("Arranging %u blocks...", total_blocks);

  for (uint by = 0; by < num_blocks_y; by++) {
    console::printf("%u of %u", by, num_blocks_y);

    remaining_blocks.resize(num_blocks_x);
    for (uint i = 0; i < num_blocks_x; i++)
      remaining_blocks[i] = i;

    color_quad_u8 match_block[16];
    utils::zero_object(match_block);
    for (uint bx = 0; bx < num_blocks_x; bx++) {
      uint best_index = 0;

      uint64 best_error = cUINT64_MAX;

      for (uint i = 0; i < remaining_blocks.size(); i++) {
        uint src_block_index = remaining_blocks[i];

        uint64 error = 0;
        for (uint y = 0; y < 4; y++) {
          for (uint x = 0; x < 4; x++) {
            const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
            error += color::elucidian_distance(c, match_block[x + y * 4], false);
          }
        }

        if (error < best_error) {
          best_error = error;
          best_index = i;
        }
      }

      uint src_block_index = remaining_blocks[best_index];

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
          match_block[x + y * 4] = c;

          img(bx * 4 + x, by * 4 + y) = c;
        }
      }

      remaining_blocks.erase_unordered(best_index);
    }
  }
#endif
}